

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
PS2KeyboardSimulationDataGenerator::Initialize
          (PS2KeyboardSimulationDataGenerator *this,U32 simulation_sample_rate,
          PS2KeyboardAnalyzerSettings *settings)

{
  SimulationChannelDescriptor *pSVar1;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  ClockGenerator::Init(54000.0,(int)this + 0x28);
  pSVar1 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)&this->mPS2KeyboardSimulationChannels,(int)this->mSettings + 0x10,
                      this->mSimulationSampleRateHz);
  this->mClock = pSVar1;
  pSVar1 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)&this->mPS2KeyboardSimulationChannels,(int)this->mSettings + 0x20,
                      this->mSimulationSampleRateHz);
  this->mData = pSVar1;
  return;
}

Assistant:

void PS2KeyboardSimulationDataGenerator::Initialize( U32 simulation_sample_rate, PS2KeyboardAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    // 1 period = 6 micorseconds; half-period = 3 microseconds
    mClockGenerator.Init( 54000.00, simulation_sample_rate );
    mClock = mPS2KeyboardSimulationChannels.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_HIGH );
    mData = mPS2KeyboardSimulationChannels.Add( mSettings->mDataChannel, mSimulationSampleRateHz, BIT_HIGH );
}